

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest9::initTest(FunctionalTest9 *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  FunctionalTest9 *in_RSI;
  allocator<char> local_d8;
  allocator<char> local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5;
  uint n_xfb_varyings;
  char *xfb_varyings [1];
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  xfb_varyings[0] = "result";
  n_xfb_varyings = 1;
  getVertexShaderBody_abi_cxx11_(&local_48,in_RSI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,glcts::fixed_sample_locations_values + 1,&local_d5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,glcts::fixed_sample_locations_values + 1,&local_d6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,glcts::fixed_sample_locations_values + 1,&local_d7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,glcts::fixed_sample_locations_values + 1,&local_d8);
  bVar2 = Utils::buildProgram(gl,&local_48,&local_68,&local_88,&local_a8,&local_c8,xfb_varyings,
                              &n_xfb_varyings,&this->m_vs_id,(GLuint *)0x0,(GLuint *)0x0,
                              (GLuint *)0x0,(GLuint *)0x0,&this->m_po_id);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar2) {
    uVar1 = this->m_n_points_to_draw;
    (*gl->genBuffers)(1,&this->m_xfb_bo_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13ae);
    (*gl->bindBuffer)(0x8c8e,this->m_xfb_bo_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b1);
    (*gl->bindBufferBase)(0x8c8e,0,this->m_xfb_bo_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindBufferBase() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b4);
    (*gl->bufferData)(0x8c8e,(ulong)(uVar1 << 4),(void *)0x0,0x88e6);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBufferData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b8);
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenVertexArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13bc);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindVertexArray() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13bf);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program failed to link successfully",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x13a7);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FunctionalTest9::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up program object */
	const char* xfb_varyings[] = { "result" };

	const unsigned int n_xfb_varyings = sizeof(xfb_varyings) / sizeof(xfb_varyings[0]);
	if (!Utils::buildProgram(gl, getVertexShaderBody(), "",					  /* tc_body */
							 "",											  /* te_body */
							 "",											  /* gs_body */
							 "",											  /* fs_body */
							 xfb_varyings, n_xfb_varyings, &m_vs_id, DE_NULL, /* out_tc_id */
							 DE_NULL,										  /* out_te_id */
							 DE_NULL,										  /* out_gs_id */
							 DE_NULL,										  /* out_fs_id */
							 &m_po_id))
	{
		TCU_FAIL("Program failed to link successfully");
	}

	/* Set up a buffer object we will use to hold XFB data */
	const unsigned int xfb_bo_size = static_cast<unsigned int>(sizeof(float) * 4 /* components */ * m_n_points_to_draw);

	gl.genBuffers(1, &m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_bo_size, DE_NULL, /* data */
				  GL_STATIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");
}